

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

stbi_uc * bmp_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  int iVar2;
  uint32 uVar3;
  uint32 uVar4;
  int iVar5;
  uint32 uVar6;
  uint32 uVar7;
  int iVar8;
  uint32 uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uchar *data;
  long lVar16;
  int iVar17;
  uchar uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  stbi_uc pal [256] [4];
  uint local_4b4;
  uint local_4b0;
  int local_498;
  int local_484;
  int local_47c;
  int local_478;
  uchar auStack_438 [1032];
  
  iVar2 = get8(s);
  if ((iVar2 == 0x42) && (iVar2 = get8(s), iVar2 == 0x4d)) {
    get32le(s);
    get8(s);
    get8(s);
    get8(s);
    get8(s);
    uVar3 = get32le(s);
    uVar4 = get32le(s);
    if (((0x38 < uVar4) || ((0x100010000001000U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) &&
       (uVar4 != 0x6c)) {
      failure_reason = "BMP type not supported: unknown";
      return (stbi_uc *)0x0;
    }
    failure_reason = "bad BMP";
    if (uVar4 == 0xc) {
      iVar2 = get8(s);
      iVar5 = get8(s);
      s->img_x = iVar5 * 0x100 + iVar2;
      iVar2 = get8(s);
      iVar5 = get8(s);
      uVar6 = iVar5 * 0x100 + iVar2;
    }
    else {
      uVar6 = get32le(s);
      s->img_x = uVar6;
      uVar6 = get32le(s);
    }
    s->img_y = uVar6;
    iVar2 = get8(s);
    iVar5 = get8(s);
    if (iVar5 * 0x100 + iVar2 != 1) {
      return (stbi_uc *)0x0;
    }
    iVar5 = get8(s);
    iVar2 = get8(s);
    iVar5 = iVar2 * 0x100 + iVar5;
    if (iVar5 == 1) {
      failure_reason = "BMP type not supported: 1-bit";
      return (stbi_uc *)0x0;
    }
    uVar6 = s->img_y;
    uVar9 = -uVar6;
    if (0 < (int)uVar6) {
      uVar9 = uVar6;
    }
    s->img_y = uVar9;
    if (uVar4 == 0xc) {
      uVar9 = 0;
      if (iVar5 < 0x18) {
        uVar12 = (int)(uVar3 - 0x26) / 3;
      }
      else {
        uVar12 = 0;
      }
      local_4b4 = 0;
      local_4b0 = 0;
      uVar15 = 0;
    }
    else {
      uVar7 = get32le(s);
      if (uVar7 - 1 < 2) {
        failure_reason = "BMP type not supported: RLE";
        return (stbi_uc *)0x0;
      }
      get32le(s);
      get32le(s);
      get32le(s);
      get32le(s);
      get32le(s);
      if (uVar4 == 0x28) {
LAB_0014bdc3:
        if (iVar5 != 0x20) {
          uVar9 = 0;
          local_4b4 = 0;
          local_4b0 = 0;
          uVar15 = 0;
          if (iVar5 != 0x10) goto LAB_0014c588;
        }
        if (uVar7 == 3) {
          uVar15 = get32le(s);
          local_4b0 = get32le(s);
          local_4b4 = get32le(s);
          if (local_4b0 == local_4b4 && uVar15 == local_4b0) {
            return (stbi_uc *)0x0;
          }
        }
        else {
          if (uVar7 != 0) {
            return (stbi_uc *)0x0;
          }
          bVar23 = iVar5 == 0x20;
          local_4b4 = 0x1f;
          if (bVar23) {
            local_4b4 = 0xff;
          }
          local_4b0 = 0x3e0;
          if (bVar23) {
            local_4b0 = 0xff00;
          }
          uVar15 = 0x7c00;
          if (bVar23) {
            uVar15 = 0xff0000;
          }
        }
        uVar9 = 0;
      }
      else {
        if (uVar4 != 0x6c) {
          if (uVar4 != 0x38) {
            __assert_fail("hsz == 108",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sidneydijkstra[P]SDEN/external/soil/src/stb_image_aug.c"
                          ,0xa15,"stbi_uc *bmp_load(stbi *, int *, int *, int *, int)");
          }
          get32le(s);
          get32le(s);
          get32le(s);
          get32le(s);
          goto LAB_0014bdc3;
        }
        uVar15 = get32le(s);
        local_4b0 = get32le(s);
        local_4b4 = get32le(s);
        uVar9 = get32le(s);
        get32le(s);
        iVar2 = 0xc;
        do {
          get32le(s);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
LAB_0014c588:
      uVar12 = 0;
      if (iVar5 < 0x10) {
        uVar12 = (int)((uVar3 - uVar4) + -0xe) >> 2;
      }
    }
    iVar2 = 4 - (uint)(uVar9 == 0);
    s->img_n = iVar2;
    if (2 < req_comp) {
      iVar2 = req_comp;
    }
    data = (uchar *)malloc((ulong)(s->img_x * iVar2 * s->img_y));
    if (data == (uchar *)0x0) {
      failure_reason = "Out of memory";
      return (stbi_uc *)0x0;
    }
    if (iVar5 < 0x10) {
      if (0x100 < (int)uVar12 || uVar12 == 0) {
LAB_0014bd46:
        free(data);
        goto LAB_0014c2f3;
      }
      if (0 < (int)uVar12) {
        uVar22 = 0;
        do {
          iVar8 = get8(s);
          auStack_438[uVar22 * 4 + 2] = (uchar)iVar8;
          iVar8 = get8(s);
          auStack_438[uVar22 * 4 + 1] = (uchar)iVar8;
          iVar8 = get8(s);
          auStack_438[uVar22 * 4] = (uchar)iVar8;
          if (uVar4 != 0xc) {
            get8(s);
          }
          auStack_438[uVar22 * 4 + 3] = 0xff;
          uVar22 = uVar22 + 1;
        } while (uVar12 != uVar22);
      }
      lVar19 = (long)(int)((uVar3 - uVar4) + uVar12 * (uVar4 == 0xc | 0xfffffffc) + -0xe);
      if ((FILE *)s->img_file == (FILE *)0x0) {
        s->img_buffer = s->img_buffer + lVar19;
      }
      else {
        fseek((FILE *)s->img_file,lVar19,1);
      }
      if (iVar5 == 4) {
        uVar12 = s->img_x + 1 >> 1;
      }
      else {
        if (iVar5 != 8) goto LAB_0014bd46;
        uVar12 = s->img_x;
      }
      if (0 < (int)s->img_y) {
        uVar22 = 0;
        iVar8 = 0;
        do {
          if (0 < (int)s->img_x) {
            iVar17 = 0;
            do {
              uVar13 = get8(s);
              uVar14 = uVar13 & 0xf;
              uVar15 = (int)uVar13 >> 4;
              if (iVar5 != 4) {
                uVar14 = 0;
                uVar15 = uVar13;
              }
              lVar19 = (long)(int)uVar22;
              uVar20 = lVar19 + 3;
              lVar16 = (long)(int)uVar15;
              data[lVar19] = auStack_438[lVar16 * 4];
              data[lVar19 + 1] = auStack_438[lVar16 * 4 + 1];
              data[lVar19 + 2] = auStack_438[lVar16 * 4 + 2];
              if (iVar2 == 4) {
                data[uVar20] = 0xff;
                uVar20 = (ulong)((int)uVar22 + 4);
              }
              uVar3 = s->img_x;
              if (iVar17 + 1U == uVar3) {
LAB_0014c424:
                uVar22 = uVar20 & 0xffffffff;
              }
              else {
                if (iVar5 == 8) {
                  uVar14 = get8(s);
                }
                lVar16 = (long)(int)uVar20;
                uVar22 = lVar16 + 3;
                lVar19 = (long)(int)uVar14;
                data[lVar16] = auStack_438[lVar19 * 4];
                data[lVar16 + 1] = auStack_438[lVar19 * 4 + 1];
                data[lVar16 + 2] = auStack_438[lVar19 * 4 + 2];
                if (iVar2 == 4) {
                  uVar20 = (ulong)((int)uVar20 + 4);
                  data[uVar22] = 0xff;
                  goto LAB_0014c424;
                }
              }
            } while ((iVar17 + 1U != uVar3) && (iVar17 = iVar17 + 2, iVar17 < (int)s->img_x));
          }
          if ((FILE *)s->img_file == (FILE *)0x0) {
            s->img_buffer = s->img_buffer + (-uVar12 & 3);
          }
          else {
            fseek((FILE *)s->img_file,(ulong)(-uVar12 & 3),1);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < (int)s->img_y);
      }
    }
    else {
      lVar19 = (long)(int)((uVar3 - uVar4) + -0xe);
      if ((FILE *)s->img_file == (FILE *)0x0) {
        s->img_buffer = s->img_buffer + lVar19;
      }
      else {
        fseek((FILE *)s->img_file,lVar19,1);
      }
      iVar8 = -3;
      if ((iVar5 == 0x18) || (iVar8 = -2, iVar5 == 0x10)) {
        uVar22 = (ulong)(iVar8 * s->img_x & 3);
      }
      else {
        uVar22 = 0;
      }
      local_498 = 0;
      bVar23 = false;
      bVar24 = false;
      if (iVar5 != 0x18) {
        if (iVar5 == 0x20) {
          bVar24 = uVar9 == 0xff000000 &&
                   (uVar15 == 0xff000000 && (local_4b0 == 0xff00 && local_4b4 == 0xff));
          bVar23 = uVar9 != 0xff000000 ||
                   (uVar15 != 0xff000000 || (local_4b0 != 0xff00 || local_4b4 != 0xff));
        }
        else {
          bVar23 = true;
          bVar24 = false;
        }
      }
      local_478 = 0;
      local_47c = 0;
      local_484 = 0;
      uVar12 = 0;
      if (bVar23) {
        if ((local_4b0 == 0 || uVar15 == 0) || local_4b4 == 0) goto LAB_0014c2f3;
        local_498 = high_bit(uVar15);
        local_498 = local_498 + -7;
        uVar12 = bitcount(uVar15);
        local_478 = high_bit(local_4b0);
        local_478 = local_478 + -7;
        local_47c = high_bit(local_4b4);
        local_47c = local_47c + -7;
        local_484 = high_bit(uVar9);
        local_484 = local_484 + -7;
      }
      if (0 < (int)s->img_y) {
        uVar20 = 0;
        iVar8 = 0;
        do {
          if (bVar23) {
            if (0 < (int)s->img_x) {
              iVar17 = 0;
              do {
                iVar1 = (int)uVar20;
                if (iVar5 == 0x10) {
                  iVar10 = get8(s);
                  iVar11 = get8(s);
                  uVar13 = iVar11 * 0x100 + iVar10;
                }
                else {
                  uVar13 = get32le(s);
                }
                iVar10 = (int)(uVar13 & uVar15) >> ((byte)local_498 & 0x1f);
                if (local_498 < 0) {
                  iVar10 = (uVar13 & uVar15) << (-(byte)local_498 & 0x1f);
                }
                uVar14 = uVar12;
                iVar11 = iVar10;
                if (uVar12 < 8) {
                  do {
                    iVar11 = iVar11 + (iVar10 >> ((byte)uVar14 & 0x1f));
                    uVar18 = (uchar)iVar11;
                    uVar14 = uVar14 + uVar12;
                  } while (uVar14 < 8);
                }
                else {
                  uVar18 = (uchar)iVar10;
                }
                iVar10 = (int)(uVar13 & local_4b0) >> ((byte)local_478 & 0x1f);
                if (local_478 < 0) {
                  iVar10 = (uVar13 & local_4b0) << (-(byte)local_478 & 0x1f);
                }
                lVar19 = (long)iVar1;
                data[lVar19] = uVar18;
                uVar14 = uVar12;
                iVar11 = iVar10;
                if (uVar12 < 8) {
                  do {
                    iVar11 = iVar11 + (iVar10 >> ((byte)uVar14 & 0x1f));
                    uVar18 = (uchar)iVar11;
                    uVar14 = uVar14 + uVar12;
                  } while (uVar14 < 8);
                }
                else {
                  uVar18 = (uchar)iVar10;
                }
                iVar10 = (int)(uVar13 & local_4b4) >> ((byte)local_47c & 0x1f);
                if (local_47c < 0) {
                  iVar10 = (uVar13 & local_4b4) << (-(byte)local_47c & 0x1f);
                }
                data[lVar19 + 1] = uVar18;
                iVar11 = iVar10;
                for (uVar14 = uVar12; uVar14 < 8; uVar14 = uVar14 + uVar12) {
                  iVar11 = iVar11 + (iVar10 >> ((byte)uVar14 & 0x1f));
                }
                data[lVar19 + 2] = (uchar)iVar11;
                if (uVar9 == 0) {
                  uVar18 = 0xff;
                }
                else {
                  iVar10 = (int)(uVar13 & uVar9) >> ((byte)local_484 & 0x1f);
                  if (local_484 < 0) {
                    iVar10 = (uVar13 & uVar9) << (-(byte)local_484 & 0x1f);
                  }
                  uVar13 = uVar12;
                  iVar11 = iVar10;
                  if (uVar12 < 8) {
                    do {
                      iVar11 = iVar11 + (iVar10 >> ((byte)uVar13 & 0x1f));
                      uVar18 = (uchar)iVar11;
                      uVar13 = uVar13 + uVar12;
                    } while (uVar13 < 8);
                  }
                  else {
                    uVar18 = (uchar)iVar10;
                  }
                }
                uVar20 = lVar19 + 3;
                if (iVar2 == 4) {
                  data[uVar20] = uVar18;
                  uVar20 = (ulong)(iVar1 + 4);
                }
                iVar17 = iVar17 + 1;
              } while (iVar17 < (int)s->img_x);
            }
          }
          else if (0 < (int)s->img_x) {
            iVar17 = 0;
            do {
              iVar1 = (int)uVar20;
              iVar10 = get8(s);
              lVar19 = (long)iVar1;
              data[lVar19 + 2] = (uchar)iVar10;
              iVar10 = get8(s);
              data[lVar19 + 1] = (uchar)iVar10;
              iVar10 = get8(s);
              data[lVar19] = (uchar)iVar10;
              uVar18 = 0xff;
              if (bVar24) {
                iVar10 = get8(s);
                uVar18 = (uchar)iVar10;
              }
              uVar20 = lVar19 + 3;
              if (iVar2 == 4) {
                data[uVar20] = uVar18;
                uVar20 = (ulong)(iVar1 + 4);
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 < (int)s->img_x);
          }
          if ((FILE *)s->img_file == (FILE *)0x0) {
            s->img_buffer = s->img_buffer + uVar22;
          }
          else {
            fseek((FILE *)s->img_file,uVar22,1);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < (int)s->img_y);
      }
    }
    if (0 < (int)uVar6) {
      uVar12 = (int)s->img_y >> 1;
      if (0 < (int)uVar12) {
        uVar13 = s->img_x * iVar2;
        uVar15 = (s->img_y - 1) * uVar13;
        uVar22 = 0;
        uVar20 = 0;
        do {
          if (0 < (int)uVar13) {
            uVar21 = 0;
            do {
              uVar18 = data[uVar21 + uVar22];
              data[uVar21 + uVar22] = data[uVar21 + uVar15];
              data[uVar21 + uVar15] = uVar18;
              uVar21 = uVar21 + 1;
            } while (uVar13 != uVar21);
          }
          uVar20 = uVar20 + 1;
          uVar15 = uVar15 - uVar13;
          uVar22 = (ulong)((int)uVar22 + uVar13);
        } while (uVar20 != uVar12);
      }
    }
    if (((req_comp == 0) || (iVar2 == req_comp)) ||
       (data = convert_format(data,iVar2,req_comp,s->img_x,s->img_y), data != (uchar *)0x0)) {
      *x = s->img_x;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = iVar2;
        return data;
      }
      return data;
    }
  }
  else {
LAB_0014c2f3:
    failure_reason = "Corrupt BMP";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *bmp_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
   uint8 *out;
   unsigned int mr=0,mg=0,mb=0,ma=0;
   stbi_uc pal[256][4];
   int psize=0,i,j,compress=0,width;
   int bpp, flip_vertically, pad, target, offset, hsz;
   if (get8(s) != 'B' || get8(s) != 'M') return epuc("not BMP", "Corrupt BMP");
   get32le(s); // discard filesize
   get16le(s); // discard reserved
   get16le(s); // discard reserved
   offset = get32le(s);
   hsz = get32le(s);
   if (hsz != 12 && hsz != 40 && hsz != 56 && hsz != 108) return epuc("unknown BMP", "BMP type not supported: unknown");
   failure_reason = "bad BMP";
   if (hsz == 12) {
      s->img_x = get16le(s);
      s->img_y = get16le(s);
   } else {
      s->img_x = get32le(s);
      s->img_y = get32le(s);
   }
   if (get16le(s) != 1) return 0;
   bpp = get16le(s);
   if (bpp == 1) return epuc("monochrome", "BMP type not supported: 1-bit");
   flip_vertically = ((int) s->img_y) > 0;
   s->img_y = abs((int) s->img_y);
   if (hsz == 12) {
      if (bpp < 24)
         psize = (offset - 14 - 24) / 3;
   } else {
      compress = get32le(s);
      if (compress == 1 || compress == 2) return epuc("BMP RLE", "BMP type not supported: RLE");
      get32le(s); // discard sizeof
      get32le(s); // discard hres
      get32le(s); // discard vres
      get32le(s); // discard colorsused
      get32le(s); // discard max important
      if (hsz == 40 || hsz == 56) {
         if (hsz == 56) {
            get32le(s);
            get32le(s);
            get32le(s);
            get32le(s);
         }
         if (bpp == 16 || bpp == 32) {
            mr = mg = mb = 0;
            if (compress == 0) {
               if (bpp == 32) {
                  mr = 0xff << 16;
                  mg = 0xff <<  8;
                  mb = 0xff <<  0;
               } else {
                  mr = 31 << 10;
                  mg = 31 <<  5;
                  mb = 31 <<  0;
               }
            } else if (compress == 3) {
               mr = get32le(s);
               mg = get32le(s);
               mb = get32le(s);
               // not documented, but generated by photoshop and handled by mspaint
               if (mr == mg && mg == mb) {
                  // ?!?!?
                  return NULL;
               }
            } else
               return NULL;
         }
      } else {
         assert(hsz == 108);
         mr = get32le(s);
         mg = get32le(s);
         mb = get32le(s);
         ma = get32le(s);
         get32le(s); // discard color space
         for (i=0; i < 12; ++i)
            get32le(s); // discard color space parameters
      }
      if (bpp < 16)
         psize = (offset - 14 - hsz) >> 2;
   }
   s->img_n = ma ? 4 : 3;
   if (req_comp && req_comp >= 3) // we can directly decode 3 or 4
      target = req_comp;
   else
      target = s->img_n; // if they want monochrome, we'll post-convert
   out = (stbi_uc *) malloc(target * s->img_x * s->img_y);
   if (!out) return epuc("outofmem", "Out of memory");
   if (bpp < 16) {
      int z=0;
      if (psize == 0 || psize > 256) { free(out); return epuc("invalid", "Corrupt BMP"); }
      for (i=0; i < psize; ++i) {
         pal[i][2] = get8(s);
         pal[i][1] = get8(s);
         pal[i][0] = get8(s);
         if (hsz != 12) get8(s);
         pal[i][3] = 255;
      }
      skip(s, offset - 14 - hsz - psize * (hsz == 12 ? 3 : 4));
      if (bpp == 4) width = (s->img_x + 1) >> 1;
      else if (bpp == 8) width = s->img_x;
      else { free(out); return epuc("bad bpp", "Corrupt BMP"); }
      pad = (-width)&3;
      for (j=0; j < (int) s->img_y; ++j) {
         for (i=0; i < (int) s->img_x; i += 2) {
            int v=get8(s),v2=0;
            if (bpp == 4) {
               v2 = v & 15;
               v >>= 4;
            }
            out[z++] = pal[v][0];
            out[z++] = pal[v][1];
            out[z++] = pal[v][2];
            if (target == 4) out[z++] = 255;
            if (i+1 == (int) s->img_x) break;
            v = (bpp == 8) ? get8(s) : v2;
            out[z++] = pal[v][0];
            out[z++] = pal[v][1];
            out[z++] = pal[v][2];
            if (target == 4) out[z++] = 255;
         }
         skip(s, pad);
      }
   } else {
      int rshift=0,gshift=0,bshift=0,ashift=0,rcount=0,gcount=0,bcount=0,acount=0;
      int z = 0;
      int easy=0;
      skip(s, offset - 14 - hsz);
      if (bpp == 24) width = 3 * s->img_x;
      else if (bpp == 16) width = 2*s->img_x;
      else /* bpp = 32 and pad = 0 */ width=0;
      pad = (-width) & 3;
      if (bpp == 24) {
         easy = 1;
      } else if (bpp == 32) {
         if (mb == 0xff && mg == 0xff00 && mr == 0xff000000 && ma == 0xff000000)
            easy = 2;
      }
      if (!easy) {
         if (!mr || !mg || !mb) return epuc("bad masks", "Corrupt BMP");
         // right shift amt to put high bit in position #7
         rshift = high_bit(mr)-7; rcount = bitcount(mr);
         gshift = high_bit(mg)-7; gcount = bitcount(mr);
         bshift = high_bit(mb)-7; bcount = bitcount(mr);
         ashift = high_bit(ma)-7; acount = bitcount(mr);
      }
      for (j=0; j < (int) s->img_y; ++j) {
         if (easy) {
            for (i=0; i < (int) s->img_x; ++i) {
               int a;
               out[z+2] = get8(s);
               out[z+1] = get8(s);
               out[z+0] = get8(s);
               z += 3;
               a = (easy == 2 ? get8(s) : 255);
               if (target == 4) out[z++] = a;
            }
         } else {
            for (i=0; i < (int) s->img_x; ++i) {
               uint32 v = (bpp == 16 ? get16le(s) : get32le(s));
               int a;
               out[z++] = shiftsigned(v & mr, rshift, rcount);
               out[z++] = shiftsigned(v & mg, gshift, gcount);
               out[z++] = shiftsigned(v & mb, bshift, bcount);
               a = (ma ? shiftsigned(v & ma, ashift, acount) : 255);
               if (target == 4) out[z++] = a;
            }
         }
         skip(s, pad);
      }
   }
   if (flip_vertically) {
      stbi_uc t;
      for (j=0; j < (int) s->img_y>>1; ++j) {
         stbi_uc *p1 = out +      j     *s->img_x*target;
         stbi_uc *p2 = out + (s->img_y-1-j)*s->img_x*target;
         for (i=0; i < (int) s->img_x*target; ++i) {
            t = p1[i], p1[i] = p2[i], p2[i] = t;
         }
      }
   }

   if (req_comp && req_comp != target) {
      out = convert_format(out, target, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // convert_format frees input on failure
   }

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = target;
   return out;
}